

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int httplib::detail::select_read(socket_t sock,time_t sec,time_t usec)

{
  int iVar1;
  undefined1 local_c0 [8];
  timeval tv;
  fd_set *__arr;
  undefined1 local_a0 [4];
  uint __i;
  fd_set fds;
  time_t usec_local;
  time_t sec_local;
  socket_t sock_local;
  
  fds.fds_bits[0xf] = usec;
  tv.tv_usec = (__suseconds_t)local_a0;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(tv.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
  }
  *(ulong *)(local_a0 + (long)(sock / 0x40) * 8) =
       1L << ((byte)((long)sock % 0x40) & 0x3f) | *(ulong *)(local_a0 + (long)(sock / 0x40) * 8);
  tv.tv_sec = fds.fds_bits[0xf];
  local_c0 = (undefined1  [8])sec;
  iVar1 = select(sock + 1,(fd_set *)local_a0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_c0);
  return iVar1;
}

Assistant:

inline int select_read(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
  struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLIN;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  return poll(&pfd_read, 1, timeout);
#else
  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  timeval tv;
  tv.tv_sec = static_cast<long>(sec);
  tv.tv_usec = static_cast<long>(usec);

  return select(static_cast<int>(sock + 1), &fds, nullptr, nullptr, &tv);
#endif
}